

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfTiledInputReadTile(ImfTiledInputFile *in,int dx,int dy,int lx,int ly)

{
  Imf_3_4::TiledRgbaInputFile::readTile((TiledRgbaInputFile *)in,dx,dy,lx,ly);
  return 1;
}

Assistant:

int
ImfTiledInputReadTile (ImfTiledInputFile* in, int dx, int dy, int lx, int ly)
{
    try
    {
        infile (in)->readTile (dx, dy, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}